

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

void __thiscall Hpipe::Context::write_to_stream(Context *this,ostream *os)

{
  uint uVar1;
  vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> local_30;
  
  std::vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>::vector
            (&local_30,
             (vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> *)this);
  PointedValues<Hpipe::Vec<const_Hpipe::CharItem_*>_>::write_to_stream
            ((PointedValues<Hpipe::Vec<const_Hpipe::CharItem_*>_> *)&local_30,os);
  if (local_30.super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  uVar1 = this->flags;
  if ((uVar1 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os," BEG",4);
    uVar1 = this->flags;
  }
  if ((uVar1 & 2) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os," EOF",4);
    uVar1 = this->flags;
  }
  if ((uVar1 & 4) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os," NOT_EOF",8);
  }
  return;
}

Assistant:

void Context::write_to_stream( std::ostream &os ) const {
    os << pointed_values( pos );
    if ( beg() )
        os << " BEG";
    if ( eof() )
        os << " EOF";
    if ( not_eof() )
        os << " NOT_EOF";
}